

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O0

void __thiscall QtPrivate::QColorWell::dropEvent(QColorWell *this,QDropEvent *e)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  socklen_t *__addr_len;
  sockaddr *__addr;
  QDropEvent *in_RSI;
  QWellArray *in_RDI;
  long in_FS_OFFSET;
  QColor QVar5;
  int i;
  QColor col;
  QRgb in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  int in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  QColor local_48;
  undefined1 *local_38;
  undefined1 *puStack_30;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  QDropEvent::mimeData(in_RSI);
  QMimeData::colorData();
  QVar5 = qvariant_cast<QColor>((QVariant *)in_RDI);
  local_48._0_8_ = QVar5._0_8_;
  local_38 = (undefined1 *)local_48._0_8_;
  puStack_30._0_6_ = QVar5.ct._4_6_;
  ::QVariant::~QVariant(&local_28);
  bVar1 = QColor::isValid((QColor *)&local_38);
  if (bVar1) {
    QDropEvent::position
              ((QDropEvent *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    QPointF::toPoint((QPointF *)in_RDI);
    iVar2 = QPoint::y((QPoint *)0x732329);
    iVar3 = QWellArray::rowAt(in_RDI,iVar2);
    QDropEvent::position((QDropEvent *)CONCAT44(in_stack_ffffffffffffff5c,iVar3));
    QPointF::toPoint((QPointF *)in_RDI);
    QPoint::x((QPoint *)0x732368);
    iVar2 = QWellArray::columnAt
                      ((QWellArray *)CONCAT44(in_stack_ffffffffffffff5c,iVar3),
                       in_stack_ffffffffffffff54);
    iVar4 = QWellArray::numRows(in_RDI);
    __addr_len = (socklen_t *)(ulong)(uint)(iVar2 * iVar4);
    iVar3 = iVar3 + iVar2 * iVar4;
    QColor::rgb();
    QWellArray::colorChanged
              ((QWellArray *)0x7323ba,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
    QEvent::accept((QEvent *)in_RSI,iVar3,__addr,__addr_len);
  }
  else {
    QEvent::ignore((QEvent *)in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorWell::dropEvent(QDropEvent *e)
{
    QColor col = qvariant_cast<QColor>(e->mimeData()->colorData());
    if (col.isValid()) {
        int i = rowAt(e->position().toPoint().y()) + columnAt(e->position().toPoint().x()) * numRows();
        emit colorChanged(i, col.rgb());
        e->accept();
    } else {
        e->ignore();
    }
}